

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

c_float osqp_toc(OSQPTimer *t)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  clock_gettime(1,(timespec *)&t->toc);
  lVar1 = (t->toc).tv_nsec;
  uVar3 = (t->tic).tv_sec;
  lVar2 = (t->tic).tv_nsec;
  lVar4 = lVar1 - lVar2;
  if (lVar4 < 0) {
    uVar3 = ~uVar3;
    lVar4 = (long)(((double)lVar1 + 1000000000.0) - (double)lVar2);
  }
  else {
    uVar3 = -uVar3;
  }
  return (double)lVar4 / 1000000000.0 + (double)(long)((t->toc).tv_sec + uVar3);
}

Assistant:

c_float osqp_toc(OSQPTimer *t)
{
  struct timespec temp;

  clock_gettime(CLOCK_MONOTONIC, &t->toc);

  if ((t->toc.tv_nsec - t->tic.tv_nsec) < 0) {
    temp.tv_sec  = t->toc.tv_sec - t->tic.tv_sec - 1;
    temp.tv_nsec = 1e9 + t->toc.tv_nsec - t->tic.tv_nsec;
  } else {
    temp.tv_sec  = t->toc.tv_sec - t->tic.tv_sec;
    temp.tv_nsec = t->toc.tv_nsec - t->tic.tv_nsec;
  }
  return (c_float)temp.tv_sec + (c_float)temp.tv_nsec / 1e9;
}